

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionSystemBullet::RegisterVisualizationCallback
          (ChCollisionSystemBullet *this,
          shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback> *callback)

{
  element_type *peVar1;
  cbtIDebugDraw *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  peVar1 = (callback->
           super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_10._M_pi =
       (callback->
       super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
    }
  }
  (this->super_ChCollisionSystem).vis_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChCollisionSystem).vis_callback.
              super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,&local_10);
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
  }
  pcVar2 = (cbtIDebugDraw *)::operator_new(0x18);
  peVar1 = (this->super_ChCollisionSystem).vis_callback.
           super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pcVar2->_vptr_cbtIDebugDraw = (_func_int **)&PTR__cbtIDebugDraw_00b3cdd8;
  pcVar2[2]._vptr_cbtIDebugDraw = (_func_int **)peVar1;
  this->m_debug_drawer = pcVar2;
  *(undefined4 *)&pcVar2[1]._vptr_cbtIDebugDraw = 0;
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[4])(this->bt_collision_world,pcVar2);
  return;
}

Assistant:

void ChCollisionSystemBullet::RegisterVisualizationCallback(std::shared_ptr<VisualizationCallback> callback) {
    ChCollisionSystem::RegisterVisualizationCallback(callback);

    m_debug_drawer = new ChDebugDrawer(vis_callback.get());
    m_debug_drawer->setDebugMode(cbtIDebugDraw::DBG_NoDebug);
    bt_collision_world->setDebugDrawer(m_debug_drawer);
}